

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

string * __thiscall Matrix::ToString_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ostringstream out;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (0 < this->n_) {
    uVar3 = 0;
    do {
      if (0 < this->m_) {
        lVar2 = 0;
        lVar4 = 0;
        do {
          if (lVar4 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          }
          operator<<((ostream *)local_1a8,
                     (Fraction *)
                     (*(long *)&(this->elements_).
                                super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                super__Vector_impl_data + lVar2));
          lVar4 = lVar4 + 1;
          lVar2 = lVar2 + 8;
        } while (lVar4 < this->m_);
      }
      uVar3 = uVar3 + 1;
      if (uVar3 != (uint)this->n_) {
        cVar1 = (char)(ostringstream *)local_1a8;
        std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
    } while ((long)uVar3 < (long)this->n_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::ToString() const {
  std::ostringstream out;
  for (int i = 0; i < GetNumRows(); ++i) {
    for (int j = 0; j < GetNumColumns(); ++j) {
      if (j > 0) {
        out << " ";
      }
      out << elements_[i][j];
    }
    if (i + 1 != GetNumRows()) {
      out << std::endl;
    }
  }

  return out.str();
}